

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestreamout_file.hpp
# Opt level: O0

BOOL __thiscall ByteStreamOutFile::seekEnd(ByteStreamOutFile *this)

{
  int iVar1;
  ByteStreamOutFile *this_local;
  
  iVar1 = fseeko((FILE *)this->file,0,2);
  return (BOOL)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

inline BOOL ByteStreamOutFile::seekEnd()
{
#if defined _WIN32 && ! defined (__MINGW32__)
  return !(_fseeki64(file, 0, SEEK_END));
#elif defined (__MINGW32__)
  return !(fseeko64(file, (off_t)0, SEEK_END));
#else
  return !(fseeko(file, (off_t)0, SEEK_END));
#endif
}